

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  uint uVar2;
  int local_f0;
  int local_e8;
  int local_e0;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_INT ref_malloc_init_i;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_68;
  REF_INT nterm;
  REF_INT local;
  REF_INT node;
  REF_GLOB global;
  REF_GLOB nnode_read;
  REF_GLOB nnode;
  REF_INT section_size;
  REF_INT file_nnode;
  REF_DBL *metric;
  FILE *pFStack_30;
  REF_INT chunk;
  FILE *file;
  REF_NODE ref_node;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  file = (FILE *)ref_grid->node;
  nnode_read = (long)file->_chain / 2;
  pFStack_30 = (FILE *)0x0;
  ref_node = (REF_NODE)filename;
  filename_local = (char *)ref_grid;
  if (ref_grid->mpi->id == 0) {
    pFStack_30 = fopen(filename,"r");
    if (pFStack_30 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_node);
    }
    if (pFStack_30 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8c9,
             "ref_part_bamg_metric","unable to open file");
      return 2;
    }
    iVar1 = __isoc99_fscanf(pFStack_30,"%d %d",(long)&nnode + 4,
                            (long)&ref_private_status_reis_ai + 4);
    if ((long)iVar1 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8ca,
             "ref_part_bamg_metric","read header",2,(long)iVar1);
      return 1;
    }
    if (nnode_read != nnode._4_4_) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8cb,
             "ref_part_bamg_metric","wrong node count",nnode_read,(long)nnode._4_4_);
      return 1;
    }
    if ((long)ref_private_status_reis_ai._4_4_ != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8cc,
             "ref_part_bamg_metric","expected 3 term 2x2 anisotropic M",3,
             (long)ref_private_status_reis_ai._4_4_);
      return 1;
    }
  }
  if (nnode_read / (long)**(int **)filename_local < 100000) {
    local_e0 = 100000;
  }
  else {
    local_e0 = (int)(nnode_read / (long)**(int **)filename_local);
  }
  if (local_e0 < nnode_read) {
    local_e8 = local_e0;
  }
  else {
    local_e8 = (int)nnode_read;
  }
  metric._4_4_ = local_e8;
  if (local_e8 * 3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8d2,
           "ref_part_bamg_metric","malloc metric of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    _section_size = malloc((long)(local_e8 * 3) << 3);
    if (_section_size == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8d2,
             "ref_part_bamg_metric","malloc metric of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_status_reis_ai_3._4_4_ = 0;
          SBORROW4(ref_private_status_reis_ai_3._4_4_,metric._4_4_ * 3) !=
          ref_private_status_reis_ai_3._4_4_ + metric._4_4_ * -3 < 0;
          ref_private_status_reis_ai_3._4_4_ = ref_private_status_reis_ai_3._4_4_ + 1) {
        *(undefined8 *)((long)_section_size + (long)ref_private_status_reis_ai_3._4_4_ * 8) =
             0xbff0000000000000;
      }
      for (global = 0; global < nnode_read; global = (int)nnode + global) {
        if ((long)metric._4_4_ < (long)file->_chain - global) {
          local_f0 = metric._4_4_;
        }
        else {
          local_f0 = (int)file->_chain - (int)global;
        }
        nnode._0_4_ = local_f0;
        if (*(int *)(*(long *)filename_local + 4) == 0) {
          for (nterm = 0; nterm < (int)nnode; nterm = nterm + 1) {
            iVar1 = __isoc99_fscanf(pFStack_30,"%lf %lf %lf",
                                    (void *)((long)_section_size + (long)(nterm * 3) * 8),
                                    (void *)((long)_section_size + (long)(nterm * 3 + 1) * 8),
                                    (void *)((long)_section_size + (long)(nterm * 3 + 2) * 8));
            if ((long)iVar1 != 3) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x8dd,"ref_part_bamg_metric","metric read error",3,(long)iVar1);
              return 1;
            }
          }
          uVar2 = ref_mpi_bcast(*(REF_MPI *)filename_local,_section_size,metric._4_4_ * 3,3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x8e1,"ref_part_bamg_metric",(ulong)uVar2,"bcast");
            return uVar2;
          }
        }
        else {
          uVar2 = ref_mpi_bcast(*(REF_MPI *)filename_local,_section_size,metric._4_4_ * 3,3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x8e5,"ref_part_bamg_metric",(ulong)uVar2,"bcast");
            return uVar2;
          }
        }
        for (nterm = 0; nterm < (int)nnode; nterm = nterm + 1) {
          _local = nterm + global;
          uVar2 = ref_node_local((REF_NODE)file,_local,&local_68);
          if ((uVar2 != 0) && (uVar2 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x8e9,"ref_part_bamg_metric",(ulong)uVar2,"local");
            return uVar2;
          }
          if ((local_68 != -1) &&
             (uVar2 = ref_node_metric_form
                                ((REF_NODE)file,local_68,
                                 *(REF_DBL *)((long)_section_size + (long)(nterm * 3) * 8),
                                 *(REF_DBL *)((long)_section_size + (long)(nterm * 3 + 1) * 8),0.0,
                                 *(REF_DBL *)((long)_section_size + (long)(nterm * 3 + 2) * 8),0.0,
                                 1.0), uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x8ee,"ref_part_bamg_metric",(ulong)uVar2,"set local node met");
            return uVar2;
          }
        }
      }
      if (_section_size != (void *)0x0) {
        free(_section_size);
      }
      if (*(int *)(*(long *)filename_local + 4) == 0) {
        iVar1 = fclose(pFStack_30);
        if ((long)iVar1 != 0) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x8f5,"ref_part_bamg_metric","close file",0,(long)iVar1);
          return 1;
        }
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT file_nnode, section_size;
  REF_GLOB nnode, nnode_read, global;
  REF_INT node, local;
  REF_INT nterm;

  nnode = ref_node_n_global(ref_node) / 2;

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    REIS(2, fscanf(file, "%d %d", &file_nnode, &nterm), "read header");
    REIS(nnode, file_nnode, "wrong node count");
    REIS(3, nterm, "expected 3 term 2x2 anisotropic M");
  }

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_grid_mpi(ref_grid)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 3 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_grid_once(ref_grid)) {
      for (node = 0; node < section_size; node++) {
        REIS(3,
             fscanf(file, "%lf %lf %lf", &(metric[0 + 3 * node]),
                    &(metric[1 + 3 * node]), &(metric[2 + 3 * node])),
             "metric read error");
      }
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_form(ref_node, local, metric[0 + 3 * node],
                                 metric[1 + 3 * node], 0, metric[2 + 3 * node],
                                 0, 1),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}